

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_state.cc
# Opt level: O3

unique_ptr<TestState,_std::default_delete<TestState>_> __thiscall
TestState::Deserialize(TestState *this,CBS *cbs,SSL_CTX *ctx)

{
  _Head_base<0UL,_ssl_session_st_*,_false> __p;
  int iVar1;
  TestState *__s;
  __single_object state;
  uint16_t version;
  uint64_t usec;
  CBS in;
  uint64_t sec;
  CBS text;
  CBS pending_session;
  _Head_base<0UL,_TestState_*,_false> local_98;
  uint16_t local_8a;
  ulong local_88;
  CBS local_80;
  uint64_t local_70;
  _Head_base<0UL,_ssl_session_st_*,_false> local_68 [2];
  undefined1 local_58 [16];
  CBS local_48;
  CBS local_38;
  
  __s = (TestState *)operator_new(200);
  memset(__s,0,0xa0);
  (__s->msg_callback_text)._M_dataplus._M_p = (pointer)&(__s->msg_callback_text).field_2;
  __s->msg_callback_ok = true;
  *(undefined8 *)&__s->explicit_renegotiates = 0;
  *(undefined8 *)((long)&(__s->get_handshake_hints_cb).super__Function_base._M_functor + 4) = 0;
  *(undefined8 *)((long)&(__s->get_handshake_hints_cb).super__Function_base._M_functor + 0xc) = 0;
  *(undefined8 *)((long)&(__s->get_handshake_hints_cb).super__Function_base._M_manager + 4) = 0;
  *(undefined4 *)((long)&(__s->get_handshake_hints_cb)._M_invoker + 4) = 0;
  __s->last_message_received = -1;
  __s->selected_credential = -1;
  local_98._M_head_impl = __s;
  iVar1 = CBS_get_u24_length_prefixed(cbs,&local_80);
  if (iVar1 != 0) {
    iVar1 = CBS_get_u16(&local_80,&local_8a);
    if ((iVar1 != 0) && (local_8a == 0)) {
      iVar1 = CBS_get_u24_length_prefixed(&local_80,&local_38);
      if (iVar1 != 0) {
        iVar1 = CBS_get_u16_length_prefixed(&local_80,&local_48);
        if (iVar1 != 0) {
          iVar1 = CBS_get_asn1_uint64(&local_80,&local_70);
          if (iVar1 != 0) {
            iVar1 = CBS_get_asn1_uint64(&local_80,&local_88);
            if ((iVar1 != 0) && (local_88 < 1000000)) {
              if (local_38.len != 0) {
                bssl::SSL_SESSION_parse((bssl *)local_68,&local_38,ctx->x509_method,ctx->pool);
                __p._M_head_impl = local_68[0]._M_head_impl;
                local_68[0]._M_head_impl = (pointer)0x0;
                std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                           &(local_98._M_head_impl)->pending_session,__p._M_head_impl);
                std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_68);
                if (((local_98._M_head_impl)->pending_session)._M_t.
                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
                    (ssl_session_st *)0x0) goto LAB_0013031f;
              }
              local_68[0]._M_head_impl = (pointer)local_58;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_68,local_48.data,local_48.data + local_48.len);
              std::__cxx11::string::operator=
                        ((string *)&(local_98._M_head_impl)->msg_callback_text,(string *)local_68);
              if (local_68[0]._M_head_impl != (pointer)local_58) {
                operator_delete(local_68[0]._M_head_impl,local_58._0_8_ + 1);
              }
              g_clock.tv_sec = local_70;
              g_clock.tv_usec = local_88;
              this->async_bio = (BIO *)local_98._M_head_impl;
              local_98._M_head_impl = (TestState *)0x0;
              goto LAB_00130326;
            }
          }
        }
      }
    }
  }
LAB_0013031f:
  this->async_bio = (BIO *)0x0;
LAB_00130326:
  std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
            ((unique_ptr<TestState,_std::default_delete<TestState>_> *)&local_98);
  return (__uniq_ptr_data<TestState,_std::default_delete<TestState>,_true,_true>)
         (__uniq_ptr_data<TestState,_std::default_delete<TestState>,_true,_true>)this;
}

Assistant:

std::unique_ptr<TestState> TestState::Deserialize(CBS *cbs, SSL_CTX *ctx) {
  CBS in, pending_session, text;
  auto state = std::make_unique<TestState>();
  uint16_t version;
  constexpr uint16_t kVersion = 0;
  uint64_t sec, usec;
  if (!CBS_get_u24_length_prefixed(cbs, &in) ||  //
      !CBS_get_u16(&in, &version) ||             //
      version > kVersion ||
      !CBS_get_u24_length_prefixed(&in, &pending_session) ||
      !CBS_get_u16_length_prefixed(&in, &text) ||
      !CBS_get_asn1_uint64(&in, &sec) ||   //
      !CBS_get_asn1_uint64(&in, &usec) ||  //
      usec >= 1000000) {
    return nullptr;
  }
  if (CBS_len(&pending_session)) {
    state->pending_session = SSL_SESSION_parse(
        &pending_session, ctx->x509_method, ctx->pool);
    if (!state->pending_session) {
      return nullptr;
    }
  }
  state->msg_callback_text = std::string(
      reinterpret_cast<const char *>(CBS_data(&text)), CBS_len(&text));
  g_clock.tv_sec = sec;
  g_clock.tv_usec = usec;
  return state;
}